

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Annotation.h
# Opt level: O2

void __thiscall
OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
annotationCircleOrDisk
          (AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *this,
          float radius,Vec3 *axis,Vec3 *center,Color *color,int segments,bool filled,bool in3d)

{
  if (enableAnnotation != '\x01') {
    return;
  }
  if (drawPhaseActive == '\x01') {
    drawCircleOrDisk(radius,axis,center,color,segments,filled,in3d);
    return;
  }
  deferredDrawCircleOrDisk(radius,axis,center,color,segments,filled,in3d);
  return;
}

Assistant:

void 
OpenSteer::AnnotationMixin<Super>::annotationCircleOrDisk (const float radius,
                                                           const Vec3& axis,
                                                           const Vec3& center,
                                                           const Color& color,
                                                           const int segments,
                                                           const bool filled,
                                                           const bool in3d) const
{
    if (enableAnnotation)
    {
        if (drawPhaseActive)
        {
            drawCircleOrDisk (radius, axis, center, color,
                              segments, filled, in3d);
        }
        else
        {
            deferredDrawCircleOrDisk (radius, axis, center, color,
                                      segments, filled, in3d);
        }
    }
}